

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O0

void rnd_pcg_seed(rnd_pcg_t *pcg,uint seed)

{
  unsigned_long_long uVar1;
  unsigned_long_long value;
  uint seed_local;
  rnd_pcg_t *pcg_local;
  
  uVar1 = rnd_internal_murmur3_avalanche64((ulong)seed << 1 | 1);
  pcg->state[0] = 0;
  pcg->state[1] = uVar1 << 1 | 1;
  rnd_pcg_next(pcg);
  uVar1 = rnd_internal_murmur3_avalanche64(uVar1);
  pcg->state[0] = uVar1 + pcg->state[0];
  rnd_pcg_next(pcg);
  return;
}

Assistant:

void rnd_pcg_seed( rnd_pcg_t* pcg, RND_U32 seed )
    {
    RND_U64 value = ( ( (RND_U64) seed ) << 1ULL ) | 1ULL;
    value = rnd_internal_murmur3_avalanche64( value );
    pcg->state[ 0 ] = 0U;
    pcg->state[ 1 ] = ( value << 1ULL ) | 1ULL;
    rnd_pcg_next( pcg );
    pcg->state[ 0 ] += rnd_internal_murmur3_avalanche64( value );
    rnd_pcg_next( pcg );
    }